

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void __thiscall MasterObjectHolder::clearBroker(MasterObjectHolder *this,int index)

{
  bool bVar1;
  size_type sVar2;
  pointer pBVar3;
  int in_ESI;
  handle broker;
  guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  *in_stack_ffffffffffffff58;
  deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
  *in_stack_ffffffffffffff60;
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  *this_00;
  int iVar4;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  local_28;
  int local_c;
  
  local_c = in_ESI;
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  ::lock(in_stack_ffffffffffffff58);
  iVar4 = local_c;
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  ::operator->(&local_28);
  sVar2 = std::
          deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
          ::size((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
                  *)0x1a1e4b);
  if ((iVar4 < (int)sVar2) && (-1 < local_c)) {
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::operator*(&local_28);
    std::
    deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    pBVar3 = std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::
             operator->((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         *)0x1a1e8d);
    pBVar3->valid = 0;
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::operator*(&local_28);
    std::
    deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
    ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::operator=
              ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    gmlc::libguarded::
    lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
    ::operator->(&local_28);
    sVar2 = std::
            deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
            ::size((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
                    *)0x1a1ed2);
    if (10 < sVar2) {
      this_00 = &local_28;
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
      ::operator->(this_00);
      std::
      deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
      ::begin(&in_stack_ffffffffffffff58->m_obj);
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
      ::operator->(this_00);
      std::
      deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
      ::end(&in_stack_ffffffffffffff58->m_obj);
      bVar1 = std::
              none_of<std::_Deque_iterator<std::unique_ptr<helics::BrokerObject,std::default_delete<helics::BrokerObject>>,std::unique_ptr<helics::BrokerObject,std::default_delete<helics::BrokerObject>>&,std::unique_ptr<helics::BrokerObject,std::default_delete<helics::BrokerObject>>*>,MasterObjectHolder::clearBroker(int)::__0>
                        (local_48,local_68);
      if (bVar1) {
        gmlc::libguarded::
        lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
        ::operator->(&local_28);
        std::
        deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
        ::clear((deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff84,iVar4));
      }
    }
  }
  gmlc::libguarded::
  lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
  ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>,_std::allocator<std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>_>_>,_std::mutex>
                  *)0x1a1f80);
  return;
}

Assistant:

void MasterObjectHolder::clearBroker(int index)
{
    auto broker = brokers.lock();
    if ((index < static_cast<int>(broker->size())) && (index >= 0)) {
        (*broker)[index]->valid = 0;
        (*broker)[index] = nullptr;
        if (broker->size() > 10) {
            if (std::none_of(broker->begin(), broker->end(), [](const auto& brk) { return static_cast<bool>(brk); })) {
                broker->clear();
            }
        }
    }
}